

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdjac2.c
# Opt level: O0

int fdjac2(cminpack_func_mn fcn_mn,void *p,int m,int n,double *x,double *fvec,double *fjac,
          int ldfjac,double epsfcn,double *wa)

{
  double dVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  code *in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  double dVar3;
  long in_stack_00000008;
  int in_stack_00000010;
  int iflag;
  double epsmch;
  double temp;
  double eps;
  int j;
  int i;
  double h;
  double local_70;
  int local_48;
  int local_44;
  double local_40;
  
  local_70 = dpmpar(1);
  if (local_70 <= in_XMM0_Qa) {
    local_70 = in_XMM0_Qa;
  }
  dVar3 = sqrt(local_70);
  local_48 = 0;
  while( true ) {
    if (in_ECX <= local_48) {
      return 0;
    }
    dVar1 = *(double *)(in_R8 + (long)local_48 * 8);
    local_40 = dVar3 * ABS(dVar1);
    if ((local_40 == 0.0) && (!NAN(local_40))) {
      local_40 = dVar3;
    }
    *(double *)(in_R8 + (long)local_48 * 8) = dVar1 + local_40;
    iVar2 = (*in_RDI)(in_RSI,in_EDX,in_ECX,in_R8,epsmch,2);
    if (iVar2 < 0) break;
    *(double *)(in_R8 + (long)local_48 * 8) = dVar1;
    for (local_44 = 0; local_44 < in_EDX; local_44 = local_44 + 1) {
      *(double *)(in_stack_00000008 + (long)(local_44 + local_48 * in_stack_00000010) * 8) =
           (*(double *)((long)epsmch + (long)local_44 * 8) - *(double *)(in_R9 + (long)local_44 * 8)
           ) / local_40;
    }
    local_48 = local_48 + 1;
  }
  return iVar2;
}

Assistant:

__cminpack_attr__
int __cminpack_func__(fdjac2)(__cminpack_decl_fcn_mn__ void *p, int m, int n, real *x, 
	const real *fvec, real *fjac, int ldfjac,
	real epsfcn, real *wa)
{
    /* Local variables */
    real h;
    int i, j;
    real eps, temp, epsmch;
    int iflag;

/*     ********** */

/*     subroutine fdjac2 */

/*     this subroutine computes a forward-difference approximation */
/*     to the m by n jacobian matrix associated with a specified */
/*     problem of m functions in n variables. */

/*     the subroutine statement is */

/*       subroutine fdjac2(fcn,m,n,x,fvec,fjac,ldfjac,iflag,epsfcn,wa) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions. fcn must be declared */
/*         in an external statement in the user calling */
/*         program, and should be written as follows. */

/*         subroutine fcn(m,n,x,fvec,iflag) */
/*         integer m,n,iflag */
/*         double precision x(n),fvec(m) */
/*         ---------- */
/*         calculate the functions at x and */
/*         return this vector in fvec. */
/*         ---------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of fdjac2. */
/*         in this case set iflag to a negative integer. */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. n must not exceed m. */

/*       x is an input array of length n. */

/*       fvec is an input array of length m which must contain the */
/*         functions evaluated at x. */

/*       fjac is an output m by n array which contains the */
/*         approximation to the jacobian matrix evaluated at x. */

/*       ldfjac is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       iflag is an integer variable which can be used to terminate */
/*         the execution of fdjac2. see description of fcn. */

/*       epsfcn is an input variable used in determining a suitable */
/*         step length for the forward-difference approximation. this */
/*         approximation assumes that the relative errors in the */
/*         functions are of the order of epsfcn. if epsfcn is less */
/*         than the machine precision, it is assumed that the relative */
/*         errors in the functions are of the order of the machine */
/*         precision. */

/*       wa is a work array of length m. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dpmpar */

/*       fortran-supplied ... dabs,dmax1,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */

/*     epsmch is the machine precision. */

    epsmch = __cminpack_func__(dpmpar)(1);

    eps = sqrt((max(epsfcn,epsmch)));
    for (j = 0; j < n; ++j) {
	temp = x[j];
	h = eps * fabs(temp);
	if (h == 0.) {
	    h = eps;
	}
	x[j] = temp + h;
        /* the last parameter of fcn_mn() is set to 2 to differentiate
           calls made to compute the function from calls made to compute
           the Jacobian (see fcn() in examples/lmfdrv.c, and how njev
           is used to compute the number of Jacobian evaluations) */
	iflag = fcn_mn(p, m, n, x, wa, 2);
	if (iflag < 0) {
            return iflag;
	}
	x[j] = temp;
	for (i = 0; i < m; ++i) {
	    fjac[i + j * ldfjac] = (wa[i] - fvec[i]) / h;
	}
    }
    return 0;

/*     last card of subroutine fdjac2. */

}